

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comment_PDU.cpp
# Opt level: O2

KBOOL __thiscall KDIS::PDU::Comment_PDU::operator==(Comment_PDU *this,Comment_PDU *Value)

{
  KBOOL KVar1;
  bool bVar2;
  
  KVar1 = Simulation_Management_Header::operator!=
                    (&this->super_Simulation_Management_Header,
                     &Value->super_Simulation_Management_Header);
  if ((((!KVar1) && (this->m_ui32NumFixedDatum == Value->m_ui32NumFixedDatum)) &&
      (this->m_ui32NumVariableDatum == Value->m_ui32NumVariableDatum)) &&
     (bVar2 = std::operator!=(&this->m_vFixedDatum,&Value->m_vFixedDatum), !bVar2)) {
    bVar2 = std::operator!=(&this->m_vVariableDatum,&Value->m_vVariableDatum);
    return !bVar2;
  }
  return false;
}

Assistant:

KBOOL Comment_PDU::operator == ( const Comment_PDU & Value ) const
{
    if( Simulation_Management_Header::operator  !=( Value ) )                     return false;
    if( m_ui32NumFixedDatum                     != Value.m_ui32NumFixedDatum )    return false;
    if( m_ui32NumVariableDatum                  != Value.m_ui32NumVariableDatum ) return false;
    if( m_vFixedDatum                           != Value.m_vFixedDatum )          return false;
    if( m_vVariableDatum                        != Value.m_vVariableDatum )       return false;
    return true;
}